

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

bool __thiscall ast::Identifier::evaluate(Identifier *this)

{
  Value_type VVar1;
  int iVar2;
  allocator local_31;
  string local_30;
  
  VVar1 = Symbol::get_type(this->symbol);
  if (VVar1 == UNDEFINED) {
    std::__cxx11::string::string((string *)&local_30,"Undefined symbol",&local_31);
    error_report(&(this->super_Expression).location,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    (this->super_Expression).type = INVALID;
  }
  else {
    (this->super_Expression).type = VVar1;
    if (VVar1 != INVALID) {
      iVar2 = Symbol::get_value(this->symbol);
      (this->super_Expression).value = iVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Identifier::evaluate()
{
	auto symbol_type = symbol->get_type();
	if (symbol_type == UNDEFINED) {
		error_report(&location, "Undefined symbol");
		type = INVALID;
		return false;
	}
	type = symbol_type;
	if (symbol_type == INVALID)
		return false;
	value = symbol->get_value();
	return true;
}